

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSTypeHandle_conflict FFSTypeHandle_by_index(FFSContext c,int index)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  FMFormat_conflict p_Var4;
  FMFormat_conflict p_Var5;
  int in_ESI;
  undefined8 *in_RDI;
  int j_1;
  FMFormat_conflict sfmf;
  FFSTypeHandle_conflict sf;
  int j;
  int subformat_count;
  int k;
  int i;
  FMFormat_conflict fmf;
  FFSTypeHandle_conflict handle;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  if (in_RDI[5] == 0) {
    pvVar3 = ffs_malloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_RDI[5] = pvVar3;
    memset((void *)in_RDI[5],0,(long)(in_ESI + 1) << 3);
    *(int *)(in_RDI + 4) = in_ESI + 1;
  }
  else if (*(int *)(in_RDI + 4) <= in_ESI) {
    pvVar3 = ffs_realloc((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
    in_RDI[5] = pvVar3;
    memset((void *)(in_RDI[5] + (long)*(int *)(in_RDI + 4) * 8),0,
           (long)((in_ESI + 1) - *(int *)(in_RDI + 4)) << 3);
    *(int *)(in_RDI + 4) = in_ESI + 1;
  }
  if (*(long *)(in_RDI[5] + (long)in_ESI * 8) == 0) {
    p_Var4 = FMformat_by_index((FMContext)*in_RDI,in_ESI);
    if (p_Var4 == (FMFormat_conflict)0x0) {
      return (FFSTypeHandle_conflict)0x0;
    }
    pvVar3 = ffs_malloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    *(void **)(in_RDI[5] + (long)in_ESI * 8) = pvVar3;
    puVar1 = *(undefined8 **)(in_RDI[5] + (long)in_ESI * 8);
    *puVar1 = in_RDI;
    *(int *)(puVar1 + 1) = in_ESI;
    puVar1[4] = 0;
    *(undefined4 *)(puVar1 + 5) = 0;
    p_Var5 = FMformat_by_index((FMContext)*in_RDI,in_ESI);
    puVar1[7] = p_Var5;
    *(undefined4 *)(puVar1 + 8) = 0;
    if (((p_Var4->subformats == (FMFormat_conflict *)0x0) ||
        (*p_Var4->subformats == (FMFormat_conflict)0x0)) && (p_Var4->recursive == 0)) {
      puVar1[2] = 0;
      puVar1[3] = 0;
    }
    else {
      for (local_34 = 0; p_Var4->subformats[local_34] != (FMFormat_conflict)0x0;
          local_34 = local_34 + 1) {
      }
      pvVar3 = ffs_malloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      puVar1[2] = pvVar3;
      for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
        pvVar3 = ffs_malloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        *(void **)(puVar1[2] + (long)local_2c * 8) = pvVar3;
        **(undefined8 **)(puVar1[2] + (long)local_2c * 8) = in_RDI;
        *(undefined4 *)(*(long *)(puVar1[2] + (long)local_2c * 8) + 8) = 0xffffffff;
        *(undefined8 *)(*(long *)(puVar1[2] + (long)local_2c * 8) + 0x20) = 0;
        *(undefined4 *)(*(long *)(puVar1[2] + (long)local_2c * 8) + 0x28) = 0;
        *(FMFormat_conflict *)(*(long *)(puVar1[2] + (long)local_2c * 8) + 0x38) =
             p_Var4->subformats[local_2c];
        *(undefined8 *)(*(long *)(puVar1[2] + (long)local_2c * 8) + 0x10) = 0;
      }
      *(undefined8 *)(puVar1[2] + (long)local_34 * 8) = 0;
      pvVar3 = ffs_malloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      puVar1[3] = pvVar3;
      memset((void *)puVar1[3],0,(long)p_Var4->field_count << 3);
      for (local_2c = 0; local_2c < p_Var4->field_count; local_2c = local_2c + 1) {
        if (p_Var4->field_subformats[local_2c] == (FMFormat_conflict)0x0) {
          *(undefined8 *)(puVar1[3] + (long)local_2c * 8) = 0;
        }
        else {
          for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
            if (p_Var4->field_subformats[local_2c] ==
                *(FMFormat_conflict *)(*(long *)(puVar1[2] + (long)local_38 * 8) + 0x38)) {
              *(undefined8 *)(puVar1[3] + (long)local_2c * 8) =
                   *(undefined8 *)(puVar1[2] + (long)local_38 * 8);
            }
          }
          if (p_Var4->field_subformats[local_2c] == p_Var4) {
            *(undefined8 **)(puVar1[3] + (long)local_2c * 8) = puVar1;
          }
        }
      }
      for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
        lVar2 = *(long *)(puVar1[2] + (long)local_30 * 8);
        p_Var5 = p_Var4->subformats[local_30];
        pvVar3 = ffs_malloc(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        *(void **)(lVar2 + 0x18) = pvVar3;
        memset(*(void **)(lVar2 + 0x18),0,(long)p_Var5->field_count << 3);
        for (local_2c = 0; local_2c < p_Var5->field_count; local_2c = local_2c + 1) {
          if (p_Var5->field_subformats[local_2c] != (FMFormat_conflict)0x0) {
            for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < local_34;
                in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
              if (p_Var5->field_subformats[local_2c] ==
                  *(FMFormat_conflict *)
                   (*(long *)(puVar1[2] + (long)in_stack_ffffffffffffffb4 * 8) + 0x38)) {
                *(undefined8 *)(*(long *)(lVar2 + 0x18) + (long)local_2c * 8) =
                     *(undefined8 *)(puVar1[2] + (long)in_stack_ffffffffffffffb4 * 8);
              }
            }
          }
        }
      }
    }
  }
  return *(FFSTypeHandle_conflict *)(in_RDI[5] + (long)in_ESI * 8);
}

Assistant:

extern
FFSTypeHandle
FFSTypeHandle_by_index(FFSContext c, int index)
{
    FFSTypeHandle handle = NULL;
    if (c->handle_list == NULL) {
	c->handle_list = malloc(sizeof(c->handle_list[0]) * (index+1));
	memset(c->handle_list, 0, sizeof(c->handle_list[0]) * (index+1));
	c->handle_list_size = index + 1;
    } else if (c->handle_list_size <= index) {
	c->handle_list = realloc(c->handle_list,
				 (index+1)*sizeof(c->handle_list[0]));
	memset(&c->handle_list[c->handle_list_size], 0, 
	       sizeof(c->handle_list[0]) * ((index+1) - c->handle_list_size));
	c->handle_list_size = index + 1;
    }
    if (c->handle_list[index] == NULL) {
	FMFormat fmf = FMformat_by_index(c->fmc, index);
	if (fmf == NULL) return NULL;
	c->handle_list[index] = malloc(sizeof(struct _FFSTypeHandle));
	handle = c->handle_list[index];
	handle->context = c;
	handle->format_id = index;
	handle->conversion = NULL;
	handle->status = not_checked;
	handle->body = FMformat_by_index(c->fmc, index);
	handle->is_fixed_target = 0;
	if ((fmf->subformats && (fmf->subformats[0] != NULL)) || fmf->recursive) {
	    int i, k, subformat_count = 0;
	    while (fmf->subformats[subformat_count] != NULL) subformat_count++;
	    handle->subformats = 
		malloc(sizeof(FFSTypeHandle)*(subformat_count+1));
	    for (i = 0 ; i < subformat_count ; i++) {
		handle->subformats[i] = malloc(sizeof(*handle->subformats[i]));
		handle->subformats[i]->context = c;
		handle->subformats[i]->format_id = -1;
		handle->subformats[i]->conversion = NULL;
		handle->subformats[i]->status = not_checked;
		handle->subformats[i]->body = fmf->subformats[i];
		handle->subformats[i]->subformats = NULL;
	    }
	    handle->subformats[subformat_count] = NULL;
	    handle->field_subformats = 
		malloc(fmf->field_count * sizeof(FFSTypeHandle));
	    memset(handle->field_subformats, 0, 
		   fmf->field_count * sizeof(FFSTypeHandle));
	    for (i = 0; i < fmf->field_count; i++) {
		if (fmf->field_subformats[i] != NULL) {
		    int j;
		    for (j = 0; j < subformat_count; j++) {
			if (fmf->field_subformats[i] == handle->subformats[j]->body) {
			    handle->field_subformats[i] = handle->subformats[j];
			}
		    }
		    if (fmf->field_subformats[i] == fmf) {
			/* recursive */
			handle->field_subformats[i] = handle;
		    }
		} else {
		    handle->field_subformats[i] = NULL;
		}
	    }
	    for (k = 0; k < subformat_count ; k++) {
		FFSTypeHandle sf = handle->subformats[k];
		FMFormat sfmf = fmf->subformats[k];
		sf->field_subformats = 
		    malloc(sfmf->field_count * sizeof(FFSTypeHandle));
		memset(sf->field_subformats, 0, 
		       sfmf->field_count * sizeof(FFSTypeHandle));
		for (i = 0; i < sfmf->field_count; i++) {
		    if (sfmf->field_subformats[i] != NULL) {
			int j;
			for (j = 0; j < subformat_count; j++) {
			    if (sfmf->field_subformats[i] == handle->subformats[j]->body) {
				sf->field_subformats[i] = handle->subformats[j];
			    }
			}
		    }
		}
	    }
	} else {
	    handle->subformats = NULL;
	    handle->field_subformats = NULL;
	}
    }
    return c->handle_list[index];
}